

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

HttpInputStreamImpl * __thiscall
kj::anon_unknown_36::HttpEntityBodyReader::getInner(HttpEntityBodyReader *this)

{
  HttpInputStreamImpl *pHVar1;
  HttpInputStreamImpl *i;
  Fault f;
  Fault local_10;
  
  pHVar1 = (this->weakInner).ptr;
  if (pHVar1 != (HttpInputStreamImpl *)0x0) {
    return pHVar1;
  }
  if (this->finished == true) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[72]>
              (&local_10,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x77a,FAILED,(char *)0x0,
               "\"bug in KJ HTTP: tried to access inner stream after it had been released\"",
               (char (*) [72])
               "bug in KJ HTTP: tried to access inner stream after it had been released");
    kj::_::Debug::Fault::fatal(&local_10);
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x77c,FAILED,(char *)0x0,"\"HTTP body input stream outlived underlying connection\"",
             (char (*) [54])"HTTP body input stream outlived underlying connection");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

KJ_IF_SOME(w, currentWrapper) {
      KJ_LOG(ERROR, "HTTP connection destroyed while HTTP body streams still exist",
          kj::getStackTrace());
      w = kj::none;
    }